

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O2

DnssecPrefixEntry * __thiscall
BinHash<DnssecPrefixEntry>::DoInsert
          (BinHash<DnssecPrefixEntry> *this,DnssecPrefixEntry *key,bool need_alloc,bool *stored)

{
  ulong uVar1;
  bool bVar2;
  uint32_t uVar3;
  DnssecPrefixEntry **ppDVar4;
  DnssecPrefixEntry *key_00;
  
  *stored = false;
  key_00 = (DnssecPrefixEntry *)0x0;
  if ((key != (DnssecPrefixEntry *)0x0) && (this->tableSize != 0)) {
    uVar3 = DnssecPrefixEntry::Hash(key);
    uVar1 = (ulong)uVar3 % (ulong)this->tableSize;
    ppDVar4 = this->hashBin;
    key_00 = (DnssecPrefixEntry *)(ppDVar4 + uVar1);
    do {
      key_00 = key_00->HashNext;
      if (key_00 == (DnssecPrefixEntry *)0x0) {
        if (need_alloc) {
          key = DnssecPrefixEntry::CreateCopy(key);
          ppDVar4 = this->hashBin;
        }
        key->HashNext = ppDVar4[uVar1];
        ppDVar4[uVar1] = key;
        *stored = true;
        this->tableCount = this->tableCount + 1;
        return key;
      }
      bVar2 = DnssecPrefixEntry::IsSameKey(key,key_00);
    } while (!bVar2);
    key_00->is_dnssec = (bool)(key_00->is_dnssec | key->is_dnssec);
    *stored = false;
  }
  return key_00;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }